

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

DescriptorPoolWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateDescriptorPool
          (DescriptorPoolWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkDescriptorPoolCreateInfo *DescrPoolCI,char *DebugName)

{
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  char *DebugName_local;
  VkDescriptorPoolCreateInfo *DescrPoolCI_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._8_8_ = DebugName;
  if (DescrPoolCI->sType != VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO) {
    Diligent::FormatString<char[26],char[67]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DescrPoolCI.sType == VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO",
               (char (*) [67])DebugName);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"CreateDescriptorPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x15c);
    std::__cxx11::string::~string((string *)local_48);
  }
  CreateVulkanObject<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14,VkResult(*)(VkDevice_T*,VkDescriptorPoolCreateInfo_const*,VkAllocationCallbacks_const*,VkDescriptorPool_T**),VkDescriptorPoolCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkDescriptorPoolCreateInfo_ptr_VkAllocationCallbacks_ptr_VkDescriptorPool_T_ptr_ptr
              *)vkCreateDescriptorPool,DescrPoolCI,(char *)msg.field_2._8_8_,"descriptor pool");
  return __return_storage_ptr__;
}

Assistant:

DescriptorPoolWrapper VulkanLogicalDevice::CreateDescriptorPool(const VkDescriptorPoolCreateInfo& DescrPoolCI, const char* DebugName) const
{
    VERIFY_EXPR(DescrPoolCI.sType == VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO);
    return CreateVulkanObject<VkDescriptorPool, VulkanHandleTypeId::DescriptorPool>(vkCreateDescriptorPool, DescrPoolCI, DebugName, "descriptor pool");
}